

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSAttribute.cpp
# Opt level: O0

void __thiscall OSAttribute::OSAttribute(OSAttribute *this,unsigned_long value)

{
  undefined8 in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__OSAttribute_00220588;
  ByteString::ByteString((ByteString *)0x1db06e);
  std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::set
            ((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
             0x1db07b);
  std::
  map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
  ::map((map<unsigned_long,_OSAttribute,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute>_>_>
         *)0x1db088);
  in_RDI[2] = in_RSI;
  *(undefined4 *)(in_RDI + 1) = 1;
  *(undefined1 *)((long)in_RDI + 0xc) = 0;
  return;
}

Assistant:

OSAttribute::OSAttribute(const unsigned long value)
{
	ulongValue = value;
	attributeType = ULONG;

	boolValue = false;
}